

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

void handleAbsEvent(_GLFWjoystick *js,int code,int value)

{
  int axis_00;
  int (*paiVar1) [2];
  int in_EDX;
  int iVar2;
  int in_ESI;
  _GLFWjoystick *in_RDI;
  float fVar3;
  int range;
  float normalized;
  input_absinfo *info;
  int *state;
  int axis;
  int hat;
  int index;
  float local_34;
  
  axis_00 = (in_RDI->linjs).absMap[in_ESI];
  if ((in_ESI < 0x10) || (0x17 < in_ESI)) {
    local_34 = (float)in_EDX;
    iVar2 = (in_RDI->linjs).absInfo[in_ESI].maximum - (in_RDI->linjs).absInfo[in_ESI].minimum;
    if (iVar2 != 0) {
      fVar3 = (local_34 - (float)(in_RDI->linjs).absInfo[in_ESI].minimum) / (float)iVar2;
      local_34 = fVar3 + fVar3 + -1.0;
    }
    _glfwInputJoystickAxis(in_RDI,axis_00,local_34);
  }
  else {
    iVar2 = (in_ESI + -0x10) % 2;
    paiVar1 = (in_RDI->linjs).hats + (in_ESI + -0x10) / 2;
    if (in_EDX == 0) {
      (*paiVar1)[iVar2] = 0;
    }
    else if (in_EDX < 0) {
      (*paiVar1)[iVar2] = 1;
    }
    else if (0 < in_EDX) {
      (*paiVar1)[iVar2] = 2;
    }
    _glfwInputJoystickHat(in_RDI,axis_00,handleAbsEvent::stateMap[(*paiVar1)[0]][(*paiVar1)[1]]);
  }
  return;
}

Assistant:

static void handleAbsEvent(_GLFWjoystick* js, int code, int value)
{
    const int index = js->linjs.absMap[code];

    if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
    {
        static const char stateMap[3][3] =
        {
            { GLFW_HAT_CENTERED, GLFW_HAT_UP,       GLFW_HAT_DOWN },
            { GLFW_HAT_LEFT,     GLFW_HAT_LEFT_UP,  GLFW_HAT_LEFT_DOWN },
            { GLFW_HAT_RIGHT,    GLFW_HAT_RIGHT_UP, GLFW_HAT_RIGHT_DOWN },
        };

        const int hat = (code - ABS_HAT0X) / 2;
        const int axis = (code - ABS_HAT0X) % 2;
        int* state = js->linjs.hats[hat];

        // NOTE: Looking at several input drivers, it seems all hat events use
        //       -1 for left / up, 0 for centered and 1 for right / down
        if (value == 0)
            state[axis] = 0;
        else if (value < 0)
            state[axis] = 1;
        else if (value > 0)
            state[axis] = 2;

        _glfwInputJoystickHat(js, index, stateMap[state[0]][state[1]]);
    }
    else
    {
        const struct input_absinfo* info = &js->linjs.absInfo[code];
        float normalized = value;

        const int range = info->maximum - info->minimum;
        if (range)
        {
            // Normalize to 0.0 -> 1.0
            normalized = (normalized - info->minimum) / range;
            // Normalize to -1.0 -> 1.0
            normalized = normalized * 2.0f - 1.0f;
        }

        _glfwInputJoystickAxis(js, index, normalized);
    }
}